

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  long in_RDX;
  QLayoutItem *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDebugStateSaver saver;
  undefined1 local_50 [8];
  QDockAreaLayoutInfo *local_48;
  QPlaceHolderItem *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_48,(QDebug *)item);
  pQVar1 = item->widgetItem;
  *(undefined1 *)&pQVar1[3]._vptr_QLayoutItem = 0;
  if (in_RDX == 0) {
    QVar2.m_data = (storage_type *)0x18;
    QVar2.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<((QTextStream *)pQVar1,(QString *)local_40);
    if (local_40[0] != (QPlaceHolderItem *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(local_40[0]->objectName).d.d)->_M_i =
           ((__atomic_base<int> *)&(local_40[0]->objectName).d.d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(local_40[0]->objectName).d.d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_40[0],2,0x10);
      }
    }
    pQVar1 = item->widgetItem;
    if (*(char *)&pQVar1[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar1,' ');
      pQVar1 = item->widgetItem;
    }
    *(QLayoutItem **)dbg.stream = pQVar1;
    pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
  }
  else {
    pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar1[2].align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
    local_50 = (undefined1  [8])pQVar1;
    operator<<(dbg,(QDockAreaLayoutItem *)local_50);
    QDebug::~QDebug((QDebug *)local_50);
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem *item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    return item ? dbg << *item : dbg << "QDockAreaLayoutItem(0x0)";
}